

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

U64 __thiscall position::attackers_of2(position *this,Square *s,Color *c)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  const_reference __src;
  U64 UVar9;
  U64 UVar10;
  reference pvVar11;
  U64 qattck;
  U64 rattck;
  U64 battck;
  value_type p;
  U64 m;
  Color *c_local;
  Square *s_local;
  position *this_local;
  
  p._M_elems[0x3f] = all_pieces(this);
  __src = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[]
                    (&(this->pcs).bitmap,(ulong)*c);
  memcpy(&battck,__src,0x200);
  UVar9 = magics::attacks<(Piece)2>(p._M_elems + 0x3f,s);
  UVar10 = magics::attacks<(Piece)3>(p._M_elems + 0x3f,s);
  uVar1 = *(ulong *)(bitboards::pattks + (ulong)*s * 8 + (long)(int)(*c ^ black) * 0x200);
  pvVar11 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)&battck,0);
  uVar2 = *pvVar11;
  uVar3 = *(ulong *)(bitboards::nmask + (ulong)*s * 8);
  pvVar11 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)&battck,1);
  uVar4 = *pvVar11;
  uVar5 = *(ulong *)(bitboards::kmask + (ulong)*s * 8);
  pvVar11 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)&battck,5);
  uVar6 = *pvVar11;
  pvVar11 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)&battck,2);
  uVar7 = *pvVar11;
  pvVar11 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)&battck,3);
  uVar8 = *pvVar11;
  pvVar11 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)&battck,4);
  return uVar1 & uVar2 | uVar3 & uVar4 | uVar5 & uVar6 | UVar9 & uVar7 | UVar10 & uVar8 |
         (UVar9 | UVar10) & *pvVar11;
}

Assistant:

U64 position::attackers_of2(const Square& s, const Color& c) const {
	// attackers of square "s" by color "c"
	U64 m = all_pieces();
	auto p = pcs.bitmap[c];
	U64 battck = magics::attacks<bishop>(m, s);
	U64 rattck = magics::attacks<rook>(m, s);
	U64 qattck = battck | rattck;

	return ((bitboards::pattks[c ^ 1][s] & p[pawn]) |
		(bitboards::nmask[s] & p[knight]) |
		(bitboards::kmask[s] & p[king]) |
		(battck & p[bishop]) |
		(rattck & p[rook]) |
		(qattck & p[queen]));
}